

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-spell.c
# Opt level: O1

wchar_t textui_get_spell_from_book
                  (player *p,char *verb,object *book,char *error,
                  _func__Bool_player_ptr_wchar_t *spell_filter)

{
  char *pcVar1;
  class_book *pcVar2;
  menu_conflict *menu;
  void *pvVar3;
  wchar_t wVar4;
  char buf [80];
  char acStack_88 [88];
  
  pcVar2 = player_object_to_book(p,book);
  pcVar1 = pcVar2->realm->spell_noun;
  track_object(p->upkeep,book);
  handle_stuff(p);
  menu = spell_menu_new(book,spell_filter,false);
  if (menu == (menu_conflict *)0x0) {
    wVar4 = L'\xffffffff';
    if (error != (char *)0x0) {
      msg("%s",error);
    }
  }
  else {
    pvVar3 = menu_priv(menu);
    screen_save();
    region_erase_bordered((region *)&menu->active);
    strnfmt(acStack_88,0x50,"%s which %s? (\'?\' to toggle description)",verb,pcVar1);
    my_strcap(acStack_88);
    prt(acStack_88,L'\0',L'\0');
    menu_select(menu,0,true);
    screen_load();
    wVar4 = *(wchar_t *)((long)pvVar3 + 0x1c);
    spell_menu_destroy(menu);
  }
  return wVar4;
}

Assistant:

int textui_get_spell_from_book(struct player *p, const char *verb,
	struct object *book, const char *error,
	bool (*spell_filter)(const struct player *p, int spell_index))
{
	const char *noun = player_object_to_book(p, book)->realm->spell_noun;
	struct menu *m;

	track_object(p->upkeep, book);
	handle_stuff(p);

	m = spell_menu_new(book, spell_filter, false);
	if (m) {
		int spell_index = spell_menu_select(m, noun, verb);
		spell_menu_destroy(m);
		return spell_index;
	} else if (error) {
		msg("%s", error);
	}

	return -1;
}